

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_loader.c
# Opt level: O2

plugin_loader_conflict plugin_loader_create(plugin_manager manager)

{
  plugin_loader_conflict l;
  size_t __n;
  char *pcVar1;
  char *pcVar2;
  undefined8 uVar3;
  undefined8 uStack_30;
  
  if (manager == (plugin_manager)0x0) {
    pcVar2 = "Invalid plugin loader manager";
    uVar3 = 0x7c;
  }
  else {
    l = (plugin_loader_conflict)malloc(0x18);
    if (l != (plugin_loader_conflict)0x0) {
      l->manager = manager;
      l->library_suffix = (char *)0x0;
      l->symbol_iface_suffix = (char *)0x0;
      pcVar2 = manager->name;
      __n = strlen(pcVar2);
      pcVar1 = (char *)malloc(__n + 2);
      if (pcVar1 == (char *)0x0) {
        pcVar2 = "plugin_loader_library_suffix";
        pcVar1 = "Invalid plugin loader library suffix allocation";
        uStack_30 = 0x47;
      }
      else {
        *pcVar1 = '_';
        memcpy(pcVar1 + 1,pcVar2,__n);
        pcVar1[__n + 1] = '\0';
        l->library_suffix = pcVar1;
        pcVar1 = (char *)malloc(__n + 0x1b);
        if (pcVar1 != (char *)0x0) {
          *pcVar1 = '_';
          memcpy(pcVar1 + 1,pcVar2,__n);
          builtin_strncpy(pcVar1 + __n + 1,"_impl_interface_singleton",0x1a);
          l->symbol_iface_suffix = pcVar1;
          return l;
        }
        pcVar2 = "plugin_loader_symbol_iface_suffix";
        pcVar1 = "Invalid plugin loader symbol suffix allocation";
        uStack_30 = 0x67;
      }
      log_write_impl_va("metacall",uStack_30,pcVar2,
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_loader.c"
                        ,3,pcVar1);
      plugin_loader_destroy(l);
      return (plugin_loader_conflict)0x0;
    }
    pcVar2 = "Invalid plugin loader allocation";
    uVar3 = 0x84;
  }
  log_write_impl_va("metacall",uVar3,"plugin_loader_create",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_loader.c"
                    ,3,pcVar2);
  return (plugin_loader_conflict)0x0;
}

Assistant:

plugin_loader plugin_loader_create(plugin_manager manager)
{
	if (manager == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin loader manager");
		return NULL;
	}

	plugin_loader l = malloc(sizeof(struct plugin_loader_type));

	if (l == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin loader allocation");
		return NULL;
	}

	l->manager = manager;
	l->library_suffix = NULL;
	l->symbol_iface_suffix = NULL;

	/* Generate the suffixes */
	size_t name_length = strlen(manager->name);

	if (plugin_loader_library_suffix(l, manager->name, name_length) != 0)
	{
		plugin_loader_destroy(l);
		return NULL;
	}

	if (plugin_loader_symbol_iface_suffix(l, manager->name, name_length) != 0)
	{
		plugin_loader_destroy(l);
		return NULL;
	}

	return l;
}